

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5MultiIterDoCompare(Fts5Iter *pIter,int iOut)

{
  u16 uVar1;
  u16 uVar2;
  Fts5CResult *pFVar3;
  long lVar4;
  long lVar5;
  int local_44;
  int res;
  Fts5CResult *pRes;
  Fts5SegIter *p2;
  Fts5SegIter *p1;
  int iRes;
  int i2;
  int i1;
  int iOut_local;
  Fts5Iter *pIter_local;
  
  pFVar3 = pIter->aFirst + iOut;
  if (iOut < pIter->nSeg / 2) {
    iRes = (int)pIter->aFirst[iOut << 1].iFirst;
    p1._4_4_ = (uint)pIter->aFirst[iOut * 2 + 1].iFirst;
  }
  else {
    iRes = (iOut - pIter->nSeg / 2) * 2;
    p1._4_4_ = iRes + 1;
  }
  lVar4 = (long)iRes;
  lVar5 = (long)(int)p1._4_4_;
  pFVar3->bTermEq = '\0';
  p1._0_2_ = (u16)p1._4_4_;
  uVar1 = (u16)p1;
  uVar2 = uVar1;
  if ((pIter->aSeg[lVar4].pLeaf != (Fts5Data *)0x0) &&
     (p1._0_2_ = (u16)iRes, uVar2 = (u16)p1, pIter->aSeg[lVar5].pLeaf != (Fts5Data *)0x0)) {
    local_44 = fts5BufferCompare(&pIter->aSeg[lVar4].term,&pIter->aSeg[lVar5].term);
    if (local_44 == 0) {
      pFVar3->bTermEq = '\x01';
      if (pIter->aSeg[lVar4].iRowid == pIter->aSeg[lVar5].iRowid) {
        pIter->aSeg[lVar4].bDel = pIter->aSeg[lVar5].bDel;
        return p1._4_4_;
      }
      local_44 = 1;
      if ((uint)(pIter->aSeg[lVar5].iRowid < pIter->aSeg[lVar4].iRowid) == pIter->bRev) {
        local_44 = -1;
      }
    }
    uVar2 = uVar1;
    if (local_44 < 0) {
      uVar2 = (u16)p1;
    }
  }
  p1._0_2_ = uVar2;
  pFVar3->iFirst = (u16)p1;
  return 0;
}

Assistant:

static int fts5MultiIterDoCompare(Fts5Iter *pIter, int iOut){
  int i1;                         /* Index of left-hand Fts5SegIter */
  int i2;                         /* Index of right-hand Fts5SegIter */
  int iRes;
  Fts5SegIter *p1;                /* Left-hand Fts5SegIter */
  Fts5SegIter *p2;                /* Right-hand Fts5SegIter */
  Fts5CResult *pRes = &pIter->aFirst[iOut];

  assert( iOut<pIter->nSeg && iOut>0 );
  assert( pIter->bRev==0 || pIter->bRev==1 );

  if( iOut>=(pIter->nSeg/2) ){
    i1 = (iOut - pIter->nSeg/2) * 2;
    i2 = i1 + 1;
  }else{
    i1 = pIter->aFirst[iOut*2].iFirst;
    i2 = pIter->aFirst[iOut*2+1].iFirst;
  }
  p1 = &pIter->aSeg[i1];
  p2 = &pIter->aSeg[i2];

  pRes->bTermEq = 0;
  if( p1->pLeaf==0 ){           /* If p1 is at EOF */
    iRes = i2;
  }else if( p2->pLeaf==0 ){     /* If p2 is at EOF */
    iRes = i1;
  }else{
    int res = fts5BufferCompare(&p1->term, &p2->term);
    if( res==0 ){
      assert_nc( i2>i1 );
      assert_nc( i2!=0 );
      pRes->bTermEq = 1;
      if( p1->iRowid==p2->iRowid ){
        p1->bDel = p2->bDel;
        return i2;
      }
      res = ((p1->iRowid > p2->iRowid)==pIter->bRev) ? -1 : +1;
    }
    assert( res!=0 );
    if( res<0 ){
      iRes = i1;
    }else{
      iRes = i2;
    }
  }

  pRes->iFirst = (u16)iRes;
  return 0;
}